

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

void __thiscall stream_buffer::pop_front(stream_buffer *this,int size)

{
  size_t sVar1;
  char *pcVar2;
  reference pvVar3;
  reference pvVar4;
  value_type tmp;
  int size_local;
  stream_buffer *this_local;
  
  if (size < 1 || 9 < size) {
    baryonyx::details::fail_fast
              ("Precondition","size >= 1 && size < stream_buffer_size",
               "/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/lib/src/parser.cpp"
               ,"302");
  }
  pvVar3 = std::array<std::basic_string_view<char,_std::char_traits<char>_>,_10UL>::operator[]
                     (&this->buffer_ptr,0);
  sVar1 = pvVar3->_M_len;
  pcVar2 = pvVar3->_M_str;
  pvVar3 = std::array<std::basic_string_view<char,_std::char_traits<char>_>,_10UL>::operator[]
                     (&this->buffer_ptr,(long)(size % 10));
  pvVar4 = std::array<std::basic_string_view<char,_std::char_traits<char>_>,_10UL>::operator[]
                     (&this->buffer_ptr,0);
  pvVar4->_M_len = pvVar3->_M_len;
  pvVar4->_M_str = pvVar3->_M_str;
  pvVar3 = std::array<std::basic_string_view<char,_std::char_traits<char>_>,_10UL>::operator[]
                     (&this->buffer_ptr,(long)((size + 1) % 10));
  pvVar4 = std::array<std::basic_string_view<char,_std::char_traits<char>_>,_10UL>::operator[]
                     (&this->buffer_ptr,1);
  pvVar4->_M_len = pvVar3->_M_len;
  pvVar4->_M_str = pvVar3->_M_str;
  pvVar3 = std::array<std::basic_string_view<char,_std::char_traits<char>_>,_10UL>::operator[]
                     (&this->buffer_ptr,(long)((size + 2) % 10));
  pvVar4 = std::array<std::basic_string_view<char,_std::char_traits<char>_>,_10UL>::operator[]
                     (&this->buffer_ptr,2);
  pvVar4->_M_len = pvVar3->_M_len;
  pvVar4->_M_str = pvVar3->_M_str;
  pvVar3 = std::array<std::basic_string_view<char,_std::char_traits<char>_>,_10UL>::operator[]
                     (&this->buffer_ptr,(long)((size + 3) % 10));
  pvVar4 = std::array<std::basic_string_view<char,_std::char_traits<char>_>,_10UL>::operator[]
                     (&this->buffer_ptr,3);
  pvVar4->_M_len = pvVar3->_M_len;
  pvVar4->_M_str = pvVar3->_M_str;
  pvVar3 = std::array<std::basic_string_view<char,_std::char_traits<char>_>,_10UL>::operator[]
                     (&this->buffer_ptr,(long)((size + 4) % 10));
  pvVar4 = std::array<std::basic_string_view<char,_std::char_traits<char>_>,_10UL>::operator[]
                     (&this->buffer_ptr,4);
  pvVar4->_M_len = pvVar3->_M_len;
  pvVar4->_M_str = pvVar3->_M_str;
  pvVar3 = std::array<std::basic_string_view<char,_std::char_traits<char>_>,_10UL>::operator[]
                     (&this->buffer_ptr,(long)((size + 5) % 10));
  pvVar4 = std::array<std::basic_string_view<char,_std::char_traits<char>_>,_10UL>::operator[]
                     (&this->buffer_ptr,5);
  pvVar4->_M_len = pvVar3->_M_len;
  pvVar4->_M_str = pvVar3->_M_str;
  pvVar3 = std::array<std::basic_string_view<char,_std::char_traits<char>_>,_10UL>::operator[]
                     (&this->buffer_ptr,(long)((size + 6) % 10));
  pvVar4 = std::array<std::basic_string_view<char,_std::char_traits<char>_>,_10UL>::operator[]
                     (&this->buffer_ptr,6);
  pvVar4->_M_len = pvVar3->_M_len;
  pvVar4->_M_str = pvVar3->_M_str;
  pvVar3 = std::array<std::basic_string_view<char,_std::char_traits<char>_>,_10UL>::operator[]
                     (&this->buffer_ptr,(long)((size + 7) % 10));
  pvVar4 = std::array<std::basic_string_view<char,_std::char_traits<char>_>,_10UL>::operator[]
                     (&this->buffer_ptr,7);
  pvVar4->_M_len = pvVar3->_M_len;
  pvVar4->_M_str = pvVar3->_M_str;
  pvVar3 = std::array<std::basic_string_view<char,_std::char_traits<char>_>,_10UL>::operator[]
                     (&this->buffer_ptr,(long)((size + 8) % 10));
  pvVar4 = std::array<std::basic_string_view<char,_std::char_traits<char>_>,_10UL>::operator[]
                     (&this->buffer_ptr,8);
  pvVar4->_M_len = pvVar3->_M_len;
  pvVar4->_M_str = pvVar3->_M_str;
  pvVar3 = std::array<std::basic_string_view<char,_std::char_traits<char>_>,_10UL>::operator[]
                     (&this->buffer_ptr,9);
  pvVar3->_M_len = sVar1;
  pvVar3->_M_str = pcVar2;
  do_push_back(this,size);
  return;
}

Assistant:

void pop_front(int size)
    {
        bx_expects(size >= 1 && size < stream_buffer_size);

        auto tmp = buffer_ptr[0];

        buffer_ptr[0] = buffer_ptr[(size + 0) % stream_buffer_size];
        buffer_ptr[1] = buffer_ptr[(size + 1) % stream_buffer_size];
        buffer_ptr[2] = buffer_ptr[(size + 2) % stream_buffer_size];
        buffer_ptr[3] = buffer_ptr[(size + 3) % stream_buffer_size];
        buffer_ptr[4] = buffer_ptr[(size + 4) % stream_buffer_size];
        buffer_ptr[5] = buffer_ptr[(size + 5) % stream_buffer_size];
        buffer_ptr[6] = buffer_ptr[(size + 6) % stream_buffer_size];
        buffer_ptr[7] = buffer_ptr[(size + 7) % stream_buffer_size];
        buffer_ptr[8] = buffer_ptr[(size + 8) % stream_buffer_size];
        buffer_ptr[9] = tmp;

        do_push_back(size);
    }